

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O3

qreal QtGuiTest::scaleFactor(QWindow *window)

{
  QDebug this;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  ScaleAndOrigin SVar2;
  QDebug local_50;
  QWindow local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lcQtGuiTest();
  if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    this.stream = local_50.stream;
    QVar1.m_data = (storage_type *)0x1c;
    QVar1.m_size = (qsizetype)&local_48.super_QSurface;
    QString::fromUtf8(QVar1);
    QTextStream::operator<<(&(this.stream)->ts,(QString *)&local_48.super_QSurface);
    if ((QArrayData *)local_48.super_QSurface._vptr_QSurface != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48.super_QSurface._vptr_QSurface)->_q_value).
      super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48.super_QSurface._vptr_QSurface)->_q_value).
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48.super_QSurface._vptr_QSurface)->_q_value).
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48.super_QSurface._vptr_QSurface,2,0x10);
      }
    }
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    (local_50.stream)->ref = (local_50.stream)->ref + 1;
    ::operator<<((QDebug)&local_48.field_0x8,&local_48);
    QDebug::~QDebug((QDebug *)&local_48.field_0x8);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug(&local_50);
  }
  SVar2 = QHighDpiScaling::scaleAndOrigin(window,(Point)ZEXT812(0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return SVar2.factor;
  }
  __stack_chk_fail();
}

Assistant:

qreal QtGuiTest::scaleFactor(const QWindow *window)
{
    Q_ASSERT_X(window,
               Q_FUNC_INFO,
               "called with nullptr");

    deb << "Calculating scaling factor: " << window;
    return QHighDpiScaling::factor(window);
}